

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapeprism.cpp
# Opt level: O0

void pzshape::TPZShapePrism::SideShapeOrder
               (int side,TPZVec<long> *id,int order,TPZGenMatrix<int> *shapeorders)

{
  TPZVec<long> *pTVar1;
  int iVar2;
  int iVar3;
  int64_t iVar4;
  int *piVar5;
  long lVar6;
  long *plVar7;
  TPZGenMatrix<int> *in_RCX;
  int in_EDX;
  TPZVec<long> *in_RSI;
  int in_EDI;
  size_t in_stack_00000118;
  char *in_stack_00000120;
  int maxAB;
  int c;
  int b;
  int a;
  int k;
  int j;
  int i;
  int ord2;
  int ord1;
  int count;
  int nshape_3;
  int il_1;
  TPZGenMatrix<int> locshapeorders_1;
  int nshape_2;
  int node_1;
  TPZManVector<long,_4> locid_1;
  int nnodes_1;
  TPZStack<int,_10> lowersides_1;
  int il;
  TPZGenMatrix<int> locshapeorders;
  int node;
  TPZManVector<long,_4> locid;
  int nnodes;
  TPZStack<int,_10> lowersides;
  int nshape_1;
  int ioy;
  int nshape;
  undefined4 in_stack_fffffffffffffcf8;
  int in_stack_fffffffffffffcfc;
  undefined4 in_stack_fffffffffffffd00;
  int in_stack_fffffffffffffd04;
  int in_stack_fffffffffffffd08;
  int in_stack_fffffffffffffd0c;
  TPZStack<int,_10> *in_stack_fffffffffffffd10;
  TPZGenMatrix<int> *in_stack_fffffffffffffd18;
  undefined4 in_stack_fffffffffffffd20;
  int in_stack_fffffffffffffd24;
  TPZVec<long> *in_stack_fffffffffffffd28;
  undefined8 in_stack_fffffffffffffd30;
  undefined4 in_stack_fffffffffffffd38;
  undefined4 in_stack_fffffffffffffd3c;
  undefined8 in_stack_fffffffffffffd40;
  int local_1c0;
  int local_1bc;
  int local_1b8;
  int local_1a4;
  int local_184;
  TPZVec<long> local_180 [2];
  int local_13c;
  int local_ec;
  int local_cc;
  TPZVec<long> local_c8 [2];
  int local_88;
  int local_2c;
  int local_28;
  int local_24;
  int local_14;
  TPZVec<long> *local_10;
  int local_4;
  
  if (in_EDI < 6) {
    iVar4 = TPZGenMatrix<int>::Rows(in_RCX);
    if (iVar4 != 1) {
      pzinternal::DebugStopImpl(in_stack_00000120,in_stack_00000118);
    }
    piVar5 = TPZGenMatrix<int>::operator()
                       ((TPZGenMatrix<int> *)
                        CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08),
                        CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                        CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
    *piVar5 = 1;
    piVar5 = TPZGenMatrix<int>::operator()
                       ((TPZGenMatrix<int> *)
                        CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08),
                        CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                        CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
    *piVar5 = 0;
    piVar5 = TPZGenMatrix<int>::operator()
                       ((TPZGenMatrix<int> *)
                        CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08),
                        CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                        CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
    *piVar5 = 0;
  }
  else {
    local_14 = in_EDX;
    if ((in_EDI < 6) || (0xe < in_EDI)) {
      local_10 = in_RSI;
      local_4 = in_EDI;
      if ((in_EDI == 0xf) || (in_EDI == 0x13)) {
        local_2c = ((in_EDX + -2) * (in_EDX + -1)) / 2;
        iVar4 = TPZGenMatrix<int>::Rows(in_RCX);
        if (iVar4 != local_2c) {
          pzinternal::DebugStopImpl(in_stack_00000120,in_stack_00000118);
        }
        TPZStack<int,_10>::TPZStack(in_stack_fffffffffffffd10);
        pztopology::TPZPrism::LowerDimensionSides
                  ((int)((ulong)in_stack_fffffffffffffd10 >> 0x20),
                   (TPZStack<int,_10> *)
                   CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
        TPZStack<int,_10>::Push
                  ((TPZStack<int,_10> *)
                   CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                   in_stack_fffffffffffffcfc);
        local_88 = pztopology::TPZPrism::NSideNodes(local_4);
        TPZManVector<long,_4>::TPZManVector
                  ((TPZManVector<long,_4> *)
                   CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20),
                   (int64_t)in_stack_fffffffffffffd18);
        local_cc = 0;
        while( true ) {
          lVar6 = (long)local_cc;
          iVar4 = TPZVec<long>::size(local_c8);
          pTVar1 = local_10;
          iVar2 = (int)((ulong)in_stack_fffffffffffffd30 >> 0x20);
          if (iVar4 <= lVar6) break;
          iVar2 = pztopology::TPZPrism::ContainedSideLocId
                            ((int)in_stack_fffffffffffffd10,in_stack_fffffffffffffd0c);
          plVar7 = TPZVec<long>::operator[](pTVar1,(long)iVar2);
          lVar6 = *plVar7;
          plVar7 = TPZVec<long>::operator[](local_c8,(long)local_cc);
          *plVar7 = lVar6;
          local_cc = local_cc + 1;
        }
        TPZGenMatrix<int>::TPZGenMatrix
                  ((TPZGenMatrix<int> *)
                   CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20),
                   (int64_t)in_stack_fffffffffffffd18,(int64_t)in_stack_fffffffffffffd10);
        TPZShapeTriang::SideShapeOrder
                  (iVar2,in_stack_fffffffffffffd28,in_stack_fffffffffffffd24,
                   in_stack_fffffffffffffd18);
        for (local_ec = 0; local_ec < local_2c; local_ec = local_ec + 1) {
          piVar5 = TPZGenMatrix<int>::operator()
                             ((TPZGenMatrix<int> *)
                              CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08),
                              CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                              CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
          iVar2 = *piVar5;
          piVar5 = TPZGenMatrix<int>::operator()
                             ((TPZGenMatrix<int> *)
                              CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08),
                              CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                              CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
          *piVar5 = iVar2;
          piVar5 = TPZGenMatrix<int>::operator()
                             ((TPZGenMatrix<int> *)
                              CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08),
                              CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                              CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
          iVar2 = *piVar5;
          piVar5 = TPZGenMatrix<int>::operator()
                             ((TPZGenMatrix<int> *)
                              CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08),
                              CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                              CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
          *piVar5 = iVar2;
          piVar5 = TPZGenMatrix<int>::operator()
                             ((TPZGenMatrix<int> *)
                              CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08),
                              CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                              CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
          iVar2 = *piVar5;
          piVar5 = TPZGenMatrix<int>::operator()
                             ((TPZGenMatrix<int> *)
                              CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08),
                              CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                              CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
          *piVar5 = iVar2;
        }
        TPZGenMatrix<int>::~TPZGenMatrix
                  ((TPZGenMatrix<int> *)
                   CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00));
        TPZManVector<long,_4>::~TPZManVector
                  ((TPZManVector<long,_4> *)
                   CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00));
        TPZStack<int,_10>::~TPZStack((TPZStack<int,_10> *)0x188d0a0);
      }
      else if ((in_EDI < 0x10) || (0x12 < in_EDI)) {
        iVar4 = TPZGenMatrix<int>::Rows(in_RCX);
        if (iVar4 != ((in_EDX + -2) * (in_EDX + -1) * (in_EDX + -1)) / 2) {
          pzinternal::DebugStopImpl(in_stack_00000120,in_stack_00000118);
        }
        iVar2 = local_14 + -2;
        for (local_1b8 = 0; local_1b8 < iVar2; local_1b8 = local_1b8 + 1) {
          for (local_1bc = 0; local_1bc < iVar2; local_1bc = local_1bc + 1) {
            for (local_1c0 = 0; local_1c0 < local_14 + -1; local_1c0 = local_1c0 + 1) {
              if ((local_1b8 + local_1bc < iVar2) && (local_1c0 < local_14 + -1)) {
                iVar3 = local_1b8 + local_1bc + 3;
                piVar5 = TPZGenMatrix<int>::operator()
                                   ((TPZGenMatrix<int> *)
                                    CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08),
                                    CONCAT44(in_stack_fffffffffffffd04,iVar3),
                                    CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
                *piVar5 = iVar3;
                in_stack_fffffffffffffd04 = local_1b8 + local_1bc + 3;
                piVar5 = TPZGenMatrix<int>::operator()
                                   ((TPZGenMatrix<int> *)
                                    CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08),
                                    CONCAT44(in_stack_fffffffffffffd04,iVar3),
                                    CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
                *piVar5 = in_stack_fffffffffffffd04;
                in_stack_fffffffffffffd08 = local_1c0 + 2;
                piVar5 = TPZGenMatrix<int>::operator()
                                   ((TPZGenMatrix<int> *)
                                    CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08),
                                    CONCAT44(in_stack_fffffffffffffd04,iVar3),
                                    CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
                *piVar5 = in_stack_fffffffffffffd08;
              }
            }
          }
        }
      }
      else {
        iVar4 = TPZGenMatrix<int>::Rows(in_RCX);
        if (iVar4 != (local_14 + -1) * (local_14 + -1)) {
          pzinternal::DebugStopImpl(in_stack_00000120,in_stack_00000118);
        }
        TPZStack<int,_10>::TPZStack(in_stack_fffffffffffffd10);
        pztopology::TPZPrism::LowerDimensionSides
                  ((int)((ulong)in_stack_fffffffffffffd10 >> 0x20),
                   (TPZStack<int,_10> *)
                   CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
        TPZStack<int,_10>::Push
                  ((TPZStack<int,_10> *)
                   CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                   in_stack_fffffffffffffcfc);
        local_13c = pztopology::TPZPrism::NSideNodes(local_4);
        TPZManVector<long,_4>::TPZManVector
                  ((TPZManVector<long,_4> *)
                   CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20),
                   (int64_t)in_stack_fffffffffffffd18);
        local_184 = 0;
        while( true ) {
          iVar4 = TPZVec<long>::size(local_180);
          pTVar1 = local_10;
          iVar3 = (int)((ulong)in_stack_fffffffffffffd40 >> 0x20);
          iVar2 = (int)((ulong)in_stack_fffffffffffffd30 >> 0x20);
          if (iVar4 <= local_184) break;
          iVar2 = pztopology::TPZPrism::ContainedSideLocId
                            ((int)in_stack_fffffffffffffd10,in_stack_fffffffffffffd0c);
          plVar7 = TPZVec<long>::operator[](pTVar1,(long)iVar2);
          lVar6 = *plVar7;
          plVar7 = TPZVec<long>::operator[](local_180,(long)local_184);
          *plVar7 = lVar6;
          local_184 = local_184 + 1;
        }
        TPZGenMatrix<int>::TPZGenMatrix
                  ((TPZGenMatrix<int> *)
                   CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20),
                   (int64_t)in_stack_fffffffffffffd18,(int64_t)in_stack_fffffffffffffd10);
        TPZShapeQuad::SideShapeOrder
                  (iVar3,(TPZVec<long> *)
                         CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),iVar2,
                   (TPZGenMatrix<int> *)in_stack_fffffffffffffd28);
        for (local_1a4 = 0; local_1a4 < (local_14 + -1) * (local_14 + -1); local_1a4 = local_1a4 + 1
            ) {
          piVar5 = TPZGenMatrix<int>::operator()
                             ((TPZGenMatrix<int> *)
                              CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08),
                              CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                              CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
          iVar2 = *piVar5;
          piVar5 = TPZGenMatrix<int>::operator()
                             ((TPZGenMatrix<int> *)
                              CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08),
                              CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                              CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
          *piVar5 = iVar2;
          piVar5 = TPZGenMatrix<int>::operator()
                             ((TPZGenMatrix<int> *)
                              CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08),
                              CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                              CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
          iVar2 = *piVar5;
          piVar5 = TPZGenMatrix<int>::operator()
                             ((TPZGenMatrix<int> *)
                              CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08),
                              CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                              CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
          *piVar5 = iVar2;
          piVar5 = TPZGenMatrix<int>::operator()
                             ((TPZGenMatrix<int> *)
                              CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08),
                              CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                              CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
          in_stack_fffffffffffffd0c = *piVar5;
          piVar5 = TPZGenMatrix<int>::operator()
                             ((TPZGenMatrix<int> *)
                              CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08),
                              CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                              CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
          *piVar5 = in_stack_fffffffffffffd0c;
        }
        TPZGenMatrix<int>::~TPZGenMatrix
                  ((TPZGenMatrix<int> *)
                   CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00));
        TPZManVector<long,_4>::~TPZManVector
                  ((TPZManVector<long,_4> *)
                   CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00));
        TPZStack<int,_10>::~TPZStack((TPZStack<int,_10> *)0x188d476);
      }
    }
    else {
      local_24 = in_EDX + -1;
      iVar4 = TPZGenMatrix<int>::Rows(in_RCX);
      if (iVar4 != local_24) {
        pzinternal::DebugStopImpl(in_stack_00000120,in_stack_00000118);
      }
      for (local_28 = 0; local_28 < local_14 + -1; local_28 = local_28 + 1) {
        iVar2 = local_28 + 2;
        piVar5 = TPZGenMatrix<int>::operator()
                           ((TPZGenMatrix<int> *)
                            CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08),
                            CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                            CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
        *piVar5 = iVar2;
      }
    }
  }
  return;
}

Assistant:

void TPZShapePrism::SideShapeOrder(const int side,  const TPZVec<int64_t> &id, const int order, TPZGenMatrix<int> &shapeorders)
    {
        //DebugStop();
        if (side<=5)
        {
            if (shapeorders.Rows() != 1)
            {
                DebugStop();
            }
            shapeorders(0,0) = 1;
            shapeorders(0,1) = 0;
            shapeorders(0,2) = 0;
        }
        else if (side>5 && side<15)
        {
            int nshape = order-1;
            if (shapeorders.Rows() != nshape)
            {
                DebugStop();
            }
            for (int ioy = 0; ioy < order-1; ioy++)
            {
                shapeorders(ioy,0) = ioy+2;
            }
        }
        else if (side == 15||side == 19)
        {
            int nshape = (order-2)*(order-1)/2;
            if (shapeorders.Rows() != nshape)
            {
                DebugStop();
            }
            TPZStack<int> lowersides;
            LowerDimensionSides(side, lowersides);
            lowersides.Push(side);
            
            //TPZVec<int> locsideorder(lowersides.size(),order);
            
            int nnodes = NSideNodes(side);
            
            TPZManVector<int64_t, 4> locid(nnodes);
            for (int node=0; node<locid.size(); node++) {
                locid[node] = id[ContainedSideLocId(side, node)];// SideNodeLocId( side, node);
            }// sera que esta pegando os ids corretos mesmo?
            
            TPZGenMatrix<int> locshapeorders(nshape,3);
            
            
            TPZShapeTriang::SideShapeOrder(6,locid, order, locshapeorders);
            
            // temos que arrumar a saida de locshapeorders para adequar a orientacao dos vetores que geram
            // a face do lado side
            
            // aqui o locshapeorders esta armazenado so para x e y
            for (int il = 0; il<nshape; il++)
            {
                shapeorders(il, 0) = locshapeorders(il, 0);
                shapeorders(il, 1) = locshapeorders(il, 1);
                shapeorders(il, 2) = locshapeorders(il, 2);
            }


        }
        else if (side >= 16 && side <=18)
        {
            if (shapeorders.Rows() != (order-1)*(order-1))
            {
                DebugStop();
            }
            TPZStack<int> lowersides;
            LowerDimensionSides(side, lowersides);
            lowersides.Push(side);
            
            //TPZVec<int> locsideorder(lowersides.size(),order);
            
            int nnodes = NSideNodes(side);
            
            TPZManVector<int64_t, 4> locid(nnodes);
            for (int node=0; node<locid.size(); node++) {
                locid[node] = id[ContainedSideLocId(side, node)];// SideNodeLocId( side, node);
            }// sera que esta pegando os ids corretos mesmo?
            
            int nshape = (order-1)*(order-1);
            TPZGenMatrix<int> locshapeorders(nshape,3);
            
            
            TPZShapeQuad::SideShapeOrder(8,locid, order, locshapeorders);
            
            // temos que arrumar a saida de locshapeorders para adequar a orientacao dos vetores que geram
            // a face do lado side
            
            // aqui o locshapeorders esta armazenado so para x e y
            for (int il = 0; il<nshape; il++)
            {
                shapeorders(il, 0) = locshapeorders(il, 0);
                shapeorders(il, 1) = locshapeorders(il, 1);
                shapeorders(il, 2) = locshapeorders(il, 2);
            }

        }
        else
        {   // interno
            int nshape = (order-2)*(order-1)*(order-1)/2;
            if (shapeorders.Rows() != nshape) {
                DebugStop();
            }
            int count = 0;
            int ord1 = order - 2;
            int ord2 = order - 1;
            for (int i=0; i<ord1; i++) {
                for (int j=0; j<ord1; j++) {
                    for (int k=0; k<ord2; k++) {
                        int a = i;
                        int b = j;
                        int c = k;
                        int maxAB = a+b;//a>b? a : b;
                        if (   ( (a+b)<ord1 )  && (c < ord2)   ) // Duvida
                        {
                            shapeorders(count,0) = 3 + maxAB;
                            shapeorders(count,1) = 3 + maxAB;
                            shapeorders(count,2) = 2 + c;
                            count++;
                        }
                        
                    }
                    
                }
            }

//            int orderplus1 = order + 2;
//            int orderplus2 = order + 1;
//            for (int i=3; i<orderplus1; i++) {
//                for (int j=3; j<orderplus1; j++) {
//                    for (int k=3; k<orderplus2; k++) {
//                        int a = i;
//                        int b = j;
//                        int c = k;
//                        if (   ( (a+b)<orderplus1 )  && (c < orderplus2)   ) // Duvida
//                        {
//                            shapeorders(count,0) = a;
//                            shapeorders(count,1) = b;
//                            shapeorders(count,2) = c;
//                            count++;
//                        }
//                        
//                    }
//                    
//                }
//            }

        }

    }